

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O1

char * allocate(uint n)

{
  char *pcVar1;
  
  if (n != 0) {
    pcVar1 = (char *)calloc(1,(ulong)(n + 10));
    if (pcVar1 == (char *)0x0) {
      no_space();
      pcVar1 = (char *)0x0;
    }
    return pcVar1;
  }
  return (char *)0x0;
}

Assistant:

char *allocate(unsigned n)
{
    register char *p;

    p = NULL;
    if (n)
    {
        /* VM: add a few bytes here, cause
         * Linux calloc does not like sizes like 32768 */
	p = CALLOC(1, n+10);
	if (!p) no_space();
    }
    return (p);
}